

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

void Llb_CoreSetVarMaps(Llb_Img_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Aig_Man_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  int *__s;
  int *__s_00;
  int *__s_01;
  int *__s_02;
  long lVar12;
  int iVar13;
  int iVar14;
  
  pVVar5 = p->vVarsCs;
  if (pVVar5 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsCs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x245,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  pVVar6 = p->vVarsNs;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsNs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x246,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x247,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNs2Glo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x248,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Cs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x249,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                  ,0x24a,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  pAVar7 = p->pAig;
  iVar1 = pAVar7->vObjs->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar9 = iVar1;
  if (iVar1 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  pVVar11->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar9 << 2);
  }
  pVVar11->pArray = __s;
  pVVar11->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  p->vCs2Glo = pVVar11;
  iVar9 = pAVar7->vObjs->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar13 = iVar9;
  }
  pVVar11->nCap = iVar13;
  if (iVar13 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar11->pArray = __s_00;
  pVVar11->nSize = iVar9;
  memset(__s_00,0xff,(long)iVar9 << 2);
  p->vNs2Glo = pVVar11;
  iVar13 = pAVar7->nRegs;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar10 = iVar13;
  if (iVar13 - 1U < 0xf) {
    iVar10 = 0x10;
  }
  pVVar11->nCap = iVar10;
  if (iVar10 == 0) {
    __s_01 = (int *)0x0;
  }
  else {
    __s_01 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar11->pArray = __s_01;
  pVVar11->nSize = iVar13;
  memset(__s_01,0xff,(long)iVar13 * 4);
  p->vGlo2Cs = pVVar11;
  iVar10 = pAVar7->nRegs;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar14 = iVar10;
  }
  pVVar11->nCap = iVar14;
  if (iVar14 == 0) {
    __s_02 = (int *)0x0;
  }
  else {
    __s_02 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar11->pArray = __s_02;
  pVVar11->nSize = iVar10;
  memset(__s_02,0xff,(long)iVar10 * 4);
  p->vGlo2Ns = pVVar11;
  if (0 < iVar10) {
    iVar14 = pVVar5->nSize;
    lVar12 = 0;
    do {
      if ((iVar14 <= lVar12) || (pVVar6->nSize <= lVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = pVVar5->pArray[lVar12];
      if (((int)uVar2 < 0) || (uVar3 = pAVar7->vObjs->nSize, (int)uVar3 <= (int)uVar2)) {
        __assert_fail("iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                      ,0x253,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
      }
      uVar4 = pVVar6->pArray[lVar12];
      if (((int)uVar4 < 0) || (uVar3 <= uVar4)) {
        __assert_fail("iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Core.c"
                      ,0x254,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
      }
      if (iVar1 <= (int)uVar2) goto LAB_00829f84;
      __s[uVar2] = (int)lVar12;
      if (((iVar9 <= (int)uVar4) || (__s_00[uVar4] = (int)lVar12, iVar13 <= lVar12)) ||
         (__s_01[lVar12] = uVar2, iVar10 <= lVar12)) goto LAB_00829f84;
      __s_02[lVar12] = uVar4;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar7->nRegs);
  }
  if (0 < pAVar7->nTruePis) {
    pVVar8 = pAVar7->vCis;
    lVar12 = 0;
    do {
      if (pVVar8->nSize <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar9 = *(int *)((long)pVVar8->pArray[lVar12] + 0x24);
      if (((long)iVar9 < 0) || (iVar1 <= iVar9)) {
LAB_00829f84:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar9] = pAVar7->nRegs + (int)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar7->nTruePis);
  }
  return;
}

Assistant:

void Llb_CoreSetVarMaps( Llb_Img_t * p )
{
    Aig_Obj_t * pObj;
    int i, iVarCs, iVarNs;
    assert( p->vVarsCs != NULL );
    assert( p->vVarsNs != NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vNs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vCs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vNs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        iVarCs = Vec_IntEntry( p->vVarsCs, i );
        iVarNs = Vec_IntEntry( p->vVarsNs, i );
        assert( iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig) );
        assert( iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig) );
        Vec_IntWriteEntry( p->vCs2Glo, iVarCs, i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarNs, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarCs );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarNs );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Vec_IntWriteEntry( p->vCs2Glo, Aig_ObjId(pObj), Aig_ManRegNum(p->pAig)+i );
}